

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

int gzeof(gzFile file)

{
  if ((((file != (gzFile)0x0) && (*file == 0x1c4f)) && (*(int *)((long)file + 0x3c) != 0)) &&
     (*(int *)((long)file + 0x80) == 0)) {
    return (int)(*(int *)((long)file + 0x38) == 0);
  }
  return 0;
}

Assistant:

int ZEXPORT gzeof(gzFile file)
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return 0;

    /* return end-of-file state */
    return state->mode == GZ_READ ?
        (state->eof && state->strm.avail_in == 0 && state->have == 0) : 0;
}